

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O0

void __thiscall PatchSecretARG::alter_world(PatchSecretARG *this,World *w)

{
  uint16_t uVar1;
  uint16_t uVar2;
  Map *pMVar3;
  vector<MapConnection,_std::allocator<MapConnection>_> *pvVar4;
  MapConnection local_60;
  MapConnection local_54;
  MapConnection local_48;
  MapConnection local_3c;
  MapPalette *local_30;
  MapPalette *blue_shrine_palette;
  MapPalette *blue_palace_palette;
  RandomizerWorld *world;
  World *w_local;
  PatchSecretARG *this_local;
  
  blue_palace_palette = (MapPalette *)w;
  world = (RandomizerWorld *)w;
  w_local = (World *)this;
  add_foxy_in_knt((RandomizerWorld *)w);
  blue_shrine_palette = build_blue_palace_palette((World *)blue_palace_palette);
  local_30 = build_blue_shrine_palette((World *)blue_palace_palette);
  pMVar3 = add_room_1((RandomizerWorld *)blue_palace_palette,blue_shrine_palette);
  this->_room_1 = pMVar3;
  pMVar3 = add_room_2((RandomizerWorld *)blue_palace_palette,blue_shrine_palette);
  this->_room_2 = pMVar3;
  pMVar3 = this->_room_1;
  uVar1 = Map::id(this->_room_2);
  Map::fall_destination(pMVar3,uVar1);
  pMVar3 = add_room_3((RandomizerWorld *)blue_palace_palette,blue_shrine_palette);
  this->_room_3 = pMVar3;
  pvVar4 = World::map_connections((World *)blue_palace_palette);
  uVar1 = Map::id(this->_room_2);
  uVar2 = Map::id(this->_room_3);
  MapConnection::MapConnection(&local_3c,uVar1,'\x12','\x0f',uVar2,'(','%','\0','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar4,&local_3c);
  add_gnomes_in_mercator((World *)blue_palace_palette);
  pMVar3 = add_room_4((RandomizerWorld *)blue_palace_palette,blue_shrine_palette);
  this->_room_4 = pMVar3;
  pvVar4 = World::map_connections((World *)blue_palace_palette);
  uVar1 = Map::id(this->_room_3);
  uVar2 = Map::id(this->_room_4);
  MapConnection::MapConnection(&local_48,uVar1,'%','\x1a',uVar2,'\x1a','\x13','\0','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar4,&local_48);
  pMVar3 = add_room_5((RandomizerWorld *)blue_palace_palette,local_30);
  this->_room_5 = pMVar3;
  pvVar4 = World::map_connections((World *)blue_palace_palette);
  uVar1 = Map::id(this->_room_4);
  uVar2 = Map::id(this->_room_5);
  MapConnection::MapConnection(&local_54,uVar1,'\x15','\x15',uVar2,'\x19','\"','\x02','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar4,&local_54);
  pMVar3 = add_room_6((RandomizerWorld *)blue_palace_palette,local_30);
  this->_room_6 = pMVar3;
  pvVar4 = World::map_connections((World *)blue_palace_palette);
  uVar1 = Map::id(this->_room_5);
  uVar2 = Map::id(this->_room_6);
  MapConnection::MapConnection(&local_60,uVar1,'\x13','\x19',uVar2,'\"','\x19','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar4,&local_60);
  add_statue_dialogues((RandomizerWorld *)blue_palace_palette);
  return;
}

Assistant:

void PatchSecretARG::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    add_foxy_in_knt(world);

    MapPalette* blue_palace_palette = build_blue_palace_palette(world);
    MapPalette* blue_shrine_palette = build_blue_shrine_palette(world);

    _room_1 = add_room_1(world, blue_palace_palette);

    _room_2 = add_room_2(world, blue_palace_palette);
    _room_1->fall_destination(_room_2->id());

    _room_3 = add_room_3(world, blue_palace_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 18, 15, _room_3->id(), 40, 37));

    add_gnomes_in_mercator(world);

    _room_4 = add_room_4(world, blue_palace_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 37, 26, _room_4->id(), 26, 19));

    _room_5 = add_room_5(world, blue_shrine_palette);
    world.map_connections().emplace_back(MapConnection(_room_4->id(), 21, 21, _room_5->id(), 25, 34, 2));

    _room_6 = add_room_6(world, blue_shrine_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_6->id(), 34, 25, 4));

    add_statue_dialogues(world);
}